

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O3

void dumps(LispPTR laddr)

{
  DLword *pDVar1;
  DLword *pDVar2;
  long lVar3;
  DLword *pDVar4;
  
  pDVar2 = Lisp_world;
  pDVar1 = Lisp_world + laddr;
  lVar3 = 0;
  pDVar4 = pDVar1;
  do {
    if (((ulong)pDVar2 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",(long)pDVar1 + lVar3);
    }
    printf("LADDR 0x%x : %d\n",(ulong)((long)pDVar4 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pDVar4 ^ 2));
    pDVar4 = pDVar4 + 1;
    lVar3 = lVar3 + 2;
  } while ((int)lVar3 != 0x50);
  return;
}

Assistant:

void dumps(LispPTR laddr) {
  int i;
  DLword *ptr;

  ptr = (DLword *)NativeAligned2FromLAddr(laddr);

  for (i = 0; i < 40; i++, ptr++)
    printf("LADDR 0x%x : %d\n", LAddrFromNative(ptr), (GETWORD(ptr) & 0xffff));
}